

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_test.c
# Opt level: O3

int main(int argc,char **argv)

{
  leveldb_writeoptions_t *options;
  uint8_t uVar1;
  int iVar2;
  int extraout_EAX;
  leveldb_comparator_t *cmp;
  leveldb_env_t *env;
  leveldb_cache_t *c;
  char *pcVar3;
  leveldb_options_t *plVar4;
  leveldb_readoptions_t *plVar5;
  leveldb_t *plVar6;
  leveldb_writebatch_t *b;
  leveldb_writebatch_t *b_00;
  leveldb_iterator_t *iter;
  size_t keylen;
  size_t vallen;
  leveldb_snapshot_t *snap;
  undefined4 extraout_var;
  leveldb_filterpolicy_t *policy;
  leveldb_t *plVar7;
  uint uVar8;
  ulong uVar9;
  char *err;
  size_t limit_len [2];
  char *limit [2];
  size_t start_len [2];
  char *start [2];
  uint64_t sizes [2];
  int pos;
  char valbuf [100];
  char *local_1a0;
  leveldb_t *local_198;
  leveldb_writeoptions_t *local_190;
  leveldb_options_t *local_188;
  char *local_180;
  leveldb_readoptions_t *local_178;
  leveldb_cache_t *local_170;
  leveldb_env_t *local_168;
  leveldb_comparator_t *local_160;
  size_t local_158 [2];
  char *local_148;
  char *pcStack_140;
  size_t local_138 [2];
  char *local_128;
  char *pcStack_120;
  uint64_t local_118;
  long local_110;
  int local_108 [28];
  char local_98 [104];
  
  local_1a0 = (char *)0x0;
  iVar2 = leveldb_major_version();
  if (iVar2 < 1) goto LAB_00106f5b;
  iVar2 = leveldb_minor_version();
  if (iVar2 < 1) goto LAB_00106f60;
  fprintf(_stderr,"=== Test %s\n","create_objects");
  phase = "create_objects";
  cmp = leveldb_comparator_create((void *)0x0,CmpDestroy,CmpCompare,CmpName);
  env = leveldb_create_default_env();
  c = leveldb_cache_create_lru(100000);
  pcVar3 = leveldb_env_get_test_directory(env);
  if (pcVar3 == (char *)0x0) goto LAB_00106f65;
  plVar4 = leveldb_options_create();
  local_160 = cmp;
  leveldb_options_set_comparator(plVar4,cmp);
  leveldb_options_set_error_if_exists(plVar4,'\x01');
  leveldb_options_set_cache(plVar4,c);
  leveldb_options_set_env(plVar4,env);
  leveldb_options_set_info_log(plVar4,(leveldb_logger_t *)0x0);
  leveldb_options_set_write_buffer_size(plVar4,100000);
  leveldb_options_set_paranoid_checks(plVar4,'\x01');
  leveldb_options_set_max_open_files(plVar4,10);
  leveldb_options_set_block_size(plVar4,0x400);
  leveldb_options_set_block_restart_interval(plVar4,8);
  leveldb_options_set_max_file_size(plVar4,0x300000);
  leveldb_options_set_compression(plVar4,0);
  plVar5 = leveldb_readoptions_create();
  leveldb_readoptions_set_verify_checksums(plVar5,'\x01');
  local_178 = plVar5;
  leveldb_readoptions_set_fill_cache(plVar5,'\0');
  local_190 = leveldb_writeoptions_create();
  leveldb_writeoptions_set_sync(local_190,'\x01');
  fprintf(_stderr,"=== Test %s\n","destroy");
  phase = "destroy";
  leveldb_destroy_db(plVar4,pcVar3,&local_1a0);
  if (local_1a0 != (char *)0x0) {
    free(local_1a0);
    local_1a0 = (char *)0x0;
  }
  local_168 = env;
  fprintf(_stderr,"=== Test %s\n","open_error");
  phase = "open_error";
  leveldb_open(plVar4,pcVar3,&local_1a0);
  if (local_1a0 == (char *)0x0) goto LAB_00106f6a;
  free(local_1a0);
  local_1a0 = (char *)0x0;
  fprintf(_stderr,"=== Test %s\n","leveldb_free");
  phase = "leveldb_free";
  leveldb_open(plVar4,pcVar3,&local_1a0);
  if (local_1a0 == (char *)0x0) goto LAB_00106f6f;
  leveldb_free(local_1a0);
  local_1a0 = (char *)0x0;
  fprintf(_stderr,"=== Test %s\n","open");
  phase = "open";
  leveldb_options_set_create_if_missing(plVar4,'\x01');
  local_180 = pcVar3;
  plVar6 = leveldb_open(plVar4,pcVar3,&local_1a0);
  plVar5 = local_178;
  local_188 = plVar4;
  if (local_1a0 != (char *)0x0) goto LAB_00106f74;
  local_170 = c;
  CheckGet(plVar6,local_178,"foo",(char *)0x0);
  fprintf(_stderr,"=== Test %s\n","put");
  phase = "put";
  leveldb_put(plVar6,local_190,"foo",3,"hello",5,&local_1a0);
  if (local_1a0 != (char *)0x0) goto LAB_00106f79;
  CheckGet(plVar6,plVar5,"foo","hello");
  local_198 = plVar6;
  fprintf(_stderr,"=== Test %s\n","compactall");
  phase = "compactall";
  leveldb_compact_range(local_198,(char *)0x0,0,(char *)0x0,0);
  CheckGet(local_198,plVar5,"foo","hello");
  fprintf(_stderr,"=== Test %s\n","compactrange");
  phase = "compactrange";
  leveldb_compact_range(local_198,"a",1,"z",1);
  CheckGet(local_198,plVar5,"foo","hello");
  fprintf(_stderr,"=== Test %s\n","writebatch");
  phase = "writebatch";
  b = leveldb_writebatch_create();
  leveldb_writebatch_put(b,"foo",3,"a",1);
  leveldb_writebatch_clear(b);
  leveldb_writebatch_put(b,"bar",3,"b",1);
  leveldb_writebatch_put(b,"box",3,"c",1);
  b_00 = leveldb_writebatch_create();
  leveldb_writebatch_delete(b_00,"bar",3);
  leveldb_writebatch_append(b,b_00);
  plVar6 = local_198;
  leveldb_writebatch_destroy(b_00);
  leveldb_write(plVar6,local_190,b,&local_1a0);
  if (local_1a0 != (char *)0x0) goto LAB_00106f7e;
  CheckGet(plVar6,plVar5,"foo","hello");
  CheckGet(plVar6,plVar5,"bar",(char *)0x0);
  CheckGet(plVar6,plVar5,"box","c");
  local_108[0] = 0;
  leveldb_writebatch_iterate(b,local_108,CheckPut,CheckDel);
  if (local_108[0] != 3) goto LAB_00106f83;
  leveldb_writebatch_destroy(b);
  fprintf(_stderr,"=== Test %s\n","iter");
  phase = "iter";
  iter = leveldb_create_iterator(plVar6,plVar5);
  uVar1 = leveldb_iter_valid(iter);
  if (uVar1 != '\0') goto LAB_00106f88;
  leveldb_iter_seek_to_first(iter);
  uVar1 = leveldb_iter_valid(iter);
  if (uVar1 == '\0') goto LAB_00106f8d;
  CheckIter(iter,"box","c");
  leveldb_iter_next(iter);
  CheckIter(iter,"foo","hello");
  leveldb_iter_prev(iter);
  CheckIter(iter,"box","c");
  leveldb_iter_prev(iter);
  uVar1 = leveldb_iter_valid(iter);
  if (uVar1 != '\0') goto LAB_00106f92;
  leveldb_iter_seek_to_last(iter);
  CheckIter(iter,"foo","hello");
  leveldb_iter_seek(iter,"b",1);
  CheckIter(iter,"box","c");
  leveldb_iter_get_error(iter,&local_1a0);
  if (local_1a0 != (char *)0x0) goto LAB_00106f97;
  leveldb_iter_destroy(iter);
  fprintf(_stderr,"=== Test %s\n","approximate_sizes");
  phase = "approximate_sizes";
  local_128 = "a";
  pcStack_120 = "k00000000000000010000";
  local_138[0] = 1;
  local_138[1] = 0x15;
  local_148 = "k00000000000000010000";
  pcStack_140 = "z";
  local_158[0] = 0x15;
  local_158[1] = 1;
  leveldb_writeoptions_set_sync(local_190,'\0');
  uVar9 = 0;
  do {
    snprintf((char *)local_108,100,"k%020d",uVar9);
    snprintf(local_98,100,"v%020d",uVar9);
    keylen = strlen((char *)local_108);
    vallen = strlen(local_98);
    leveldb_put(local_198,local_190,(char *)local_108,keylen,local_98,vallen,&local_1a0);
    plVar6 = local_198;
    if (local_1a0 != (char *)0x0) {
      main_cold_10();
      goto LAB_00106f47;
    }
    uVar8 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar8;
  } while (uVar8 != 20000);
  leveldb_approximate_sizes(local_198,2,&local_128,local_138,&local_148,local_158,&local_118);
  plVar5 = local_178;
  plVar4 = local_188;
  if (local_118 == 0) goto LAB_00106f9c;
  if (local_110 == 0) goto LAB_00106fa1;
  fprintf(_stderr,"=== Test %s\n","property");
  phase = "property";
  pcVar3 = leveldb_property_value(plVar6,"nosuchprop");
  if (pcVar3 != (char *)0x0) goto LAB_00106fa6;
  pcVar3 = leveldb_property_value(plVar6,"leveldb.stats");
  if (pcVar3 == (char *)0x0) goto LAB_00106fab;
  free(pcVar3);
  fprintf(_stderr,"=== Test %s\n","snapshot");
  phase = "snapshot";
  snap = leveldb_create_snapshot(plVar6);
  leveldb_delete(plVar6,local_190,"foo",3,&local_1a0);
  if (local_1a0 != (char *)0x0) goto LAB_00106fb0;
  leveldb_readoptions_set_snapshot(plVar5,snap);
  CheckGet(plVar6,plVar5,"foo","hello");
  leveldb_readoptions_set_snapshot(plVar5,(leveldb_snapshot_t *)0x0);
  CheckGet(plVar6,plVar5,"foo",(char *)0x0);
  leveldb_release_snapshot(plVar6,snap);
  fprintf(_stderr,"=== Test %s\n","repair");
  phase = "repair";
  leveldb_close(plVar6);
  leveldb_options_set_create_if_missing(plVar4,'\0');
  leveldb_options_set_error_if_exists(plVar4,'\0');
  pcVar3 = local_180;
  leveldb_repair_db(plVar4,local_180,&local_1a0);
  if (local_1a0 == (char *)0x0) {
    plVar6 = leveldb_open(plVar4,pcVar3,&local_1a0);
    if (local_1a0 != (char *)0x0) goto LAB_00106fba;
    CheckGet(plVar6,plVar5,"foo",(char *)0x0);
    CheckGet(plVar6,plVar5,"bar",(char *)0x0);
    CheckGet(plVar6,plVar5,"box","c");
    leveldb_options_set_create_if_missing(plVar4,'\x01');
    leveldb_options_set_error_if_exists(plVar4,'\x01');
    iVar2 = fprintf(_stderr,"=== Test %s\n","filter");
    phase = "filter";
    plVar7 = (leveldb_t *)CONCAT71((int7)(CONCAT44(extraout_var,iVar2) >> 8),1);
    while (local_1a0 == (char *)0x0) {
      local_198 = plVar7;
      if ((char)plVar7 == '\0') {
        policy = leveldb_filterpolicy_create_bloom(10);
      }
      else {
        policy = leveldb_filterpolicy_create
                           ((void *)0x0,FilterDestroy,FilterCreate,FilterKeyMatch,FilterName);
      }
      leveldb_close(plVar6);
      pcVar3 = local_180;
      plVar4 = local_188;
      leveldb_destroy_db(local_188,local_180,&local_1a0);
      leveldb_options_set_filter_policy(plVar4,policy);
      plVar6 = leveldb_open(plVar4,pcVar3,&local_1a0);
      options = local_190;
      if (local_1a0 != (char *)0x0) goto LAB_00106f47;
      leveldb_put(plVar6,local_190,"foo",3,"foovalue",8,&local_1a0);
      if (local_1a0 != (char *)0x0) goto LAB_00106f56;
      leveldb_put(plVar6,options,"bar",3,"barvalue",8,&local_1a0);
      if (local_1a0 != (char *)0x0) goto LAB_00106f51;
      leveldb_compact_range(plVar6,(char *)0x0,0,(char *)0x0,0);
      plVar5 = local_178;
      fake_filter_result = 0;
      CheckGet(plVar6,local_178,"foo","foovalue");
      CheckGet(plVar6,plVar5,"bar","barvalue");
      if (phase == (char *)0x0) {
        fake_filter_result = 1;
        CheckGet(plVar6,plVar5,"foo",(char *)0x0);
        CheckGet(plVar6,plVar5,"bar",(char *)0x0);
        fake_filter_result = 0;
        CheckGet(plVar6,plVar5,"foo","foovalue");
        CheckGet(plVar6,plVar5,"bar","barvalue");
      }
      leveldb_options_set_filter_policy(local_188,(leveldb_filterpolicy_t *)0x0);
      leveldb_filterpolicy_destroy(policy);
      plVar7 = (leveldb_t *)0x0;
      if (((ulong)local_198 & 1) == 0) {
        fprintf(_stderr,"=== Test %s\n","cleanup");
        phase = "cleanup";
        leveldb_close(plVar6);
        leveldb_options_destroy(local_188);
        leveldb_readoptions_destroy(plVar5);
        leveldb_writeoptions_destroy(local_190);
        leveldb_free(local_180);
        leveldb_cache_destroy(local_170);
        leveldb_comparator_destroy(local_160);
        leveldb_env_destroy(local_168);
        fwrite("PASS\n",5,1,_stderr);
        return 0;
      }
    }
    goto LAB_00106f4c;
  }
  goto LAB_00106fb5;
LAB_00106f47:
  main_cold_16();
LAB_00106f4c:
  main_cold_15();
LAB_00106f51:
  main_cold_18();
LAB_00106f56:
  main_cold_17();
LAB_00106f5b:
  main_cold_1();
LAB_00106f60:
  main_cold_2();
LAB_00106f65:
  main_cold_25();
LAB_00106f6a:
  main_cold_24();
LAB_00106f6f:
  main_cold_23();
LAB_00106f74:
  main_cold_3();
LAB_00106f79:
  main_cold_4();
LAB_00106f7e:
  main_cold_5();
LAB_00106f83:
  main_cold_6();
LAB_00106f88:
  main_cold_7();
LAB_00106f8d:
  main_cold_22();
LAB_00106f92:
  main_cold_8();
LAB_00106f97:
  main_cold_9();
LAB_00106f9c:
  main_cold_21();
LAB_00106fa1:
  main_cold_20();
LAB_00106fa6:
  main_cold_11();
LAB_00106fab:
  main_cold_19();
LAB_00106fb0:
  main_cold_12();
LAB_00106fb5:
  main_cold_13();
LAB_00106fba:
  main_cold_14();
  return extraout_EAX;
}

Assistant:

int main(int argc, char** argv) {
  leveldb_t* db;
  leveldb_comparator_t* cmp;
  leveldb_cache_t* cache;
  leveldb_env_t* env;
  leveldb_options_t* options;
  leveldb_readoptions_t* roptions;
  leveldb_writeoptions_t* woptions;
  char* dbname;
  char* err = NULL;
  int run = -1;

  CheckCondition(leveldb_major_version() >= 1);
  CheckCondition(leveldb_minor_version() >= 1);

  StartPhase("create_objects");
  cmp = leveldb_comparator_create(NULL, CmpDestroy, CmpCompare, CmpName);
  env = leveldb_create_default_env();
  cache = leveldb_cache_create_lru(100000);
  dbname = leveldb_env_get_test_directory(env);
  CheckCondition(dbname != NULL);

  options = leveldb_options_create();
  leveldb_options_set_comparator(options, cmp);
  leveldb_options_set_error_if_exists(options, 1);
  leveldb_options_set_cache(options, cache);
  leveldb_options_set_env(options, env);
  leveldb_options_set_info_log(options, NULL);
  leveldb_options_set_write_buffer_size(options, 100000);
  leveldb_options_set_paranoid_checks(options, 1);
  leveldb_options_set_max_open_files(options, 10);
  leveldb_options_set_block_size(options, 1024);
  leveldb_options_set_block_restart_interval(options, 8);
  leveldb_options_set_max_file_size(options, 3 << 20);
  leveldb_options_set_compression(options, leveldb_no_compression);

  roptions = leveldb_readoptions_create();
  leveldb_readoptions_set_verify_checksums(roptions, 1);
  leveldb_readoptions_set_fill_cache(roptions, 0);

  woptions = leveldb_writeoptions_create();
  leveldb_writeoptions_set_sync(woptions, 1);

  StartPhase("destroy");
  leveldb_destroy_db(options, dbname, &err);
  Free(&err);

  StartPhase("open_error");
  db = leveldb_open(options, dbname, &err);
  CheckCondition(err != NULL);
  Free(&err);

  StartPhase("leveldb_free");
  db = leveldb_open(options, dbname, &err);
  CheckCondition(err != NULL);
  leveldb_free(err);
  err = NULL;

  StartPhase("open");
  leveldb_options_set_create_if_missing(options, 1);
  db = leveldb_open(options, dbname, &err);
  CheckNoError(err);
  CheckGet(db, roptions, "foo", NULL);

  StartPhase("put");
  leveldb_put(db, woptions, "foo", 3, "hello", 5, &err);
  CheckNoError(err);
  CheckGet(db, roptions, "foo", "hello");

  StartPhase("compactall");
  leveldb_compact_range(db, NULL, 0, NULL, 0);
  CheckGet(db, roptions, "foo", "hello");

  StartPhase("compactrange");
  leveldb_compact_range(db, "a", 1, "z", 1);
  CheckGet(db, roptions, "foo", "hello");

  StartPhase("writebatch");
  {
    leveldb_writebatch_t* wb = leveldb_writebatch_create();
    leveldb_writebatch_put(wb, "foo", 3, "a", 1);
    leveldb_writebatch_clear(wb);
    leveldb_writebatch_put(wb, "bar", 3, "b", 1);
    leveldb_writebatch_put(wb, "box", 3, "c", 1);

    leveldb_writebatch_t* wb2 = leveldb_writebatch_create();
    leveldb_writebatch_delete(wb2, "bar", 3);
    leveldb_writebatch_append(wb, wb2);
    leveldb_writebatch_destroy(wb2);

    leveldb_write(db, woptions, wb, &err);
    CheckNoError(err);
    CheckGet(db, roptions, "foo", "hello");
    CheckGet(db, roptions, "bar", NULL);
    CheckGet(db, roptions, "box", "c");

    int pos = 0;
    leveldb_writebatch_iterate(wb, &pos, CheckPut, CheckDel);
    CheckCondition(pos == 3);
    leveldb_writebatch_destroy(wb);
  }

  StartPhase("iter");
  {
    leveldb_iterator_t* iter = leveldb_create_iterator(db, roptions);
    CheckCondition(!leveldb_iter_valid(iter));
    leveldb_iter_seek_to_first(iter);
    CheckCondition(leveldb_iter_valid(iter));
    CheckIter(iter, "box", "c");
    leveldb_iter_next(iter);
    CheckIter(iter, "foo", "hello");
    leveldb_iter_prev(iter);
    CheckIter(iter, "box", "c");
    leveldb_iter_prev(iter);
    CheckCondition(!leveldb_iter_valid(iter));
    leveldb_iter_seek_to_last(iter);
    CheckIter(iter, "foo", "hello");
    leveldb_iter_seek(iter, "b", 1);
    CheckIter(iter, "box", "c");
    leveldb_iter_get_error(iter, &err);
    CheckNoError(err);
    leveldb_iter_destroy(iter);
  }

  StartPhase("approximate_sizes");
  {
    int i;
    int n = 20000;
    char keybuf[100];
    char valbuf[100];
    uint64_t sizes[2];
    const char* start[2] = { "a", "k00000000000000010000" };
    size_t start_len[2] = { 1, 21 };
    const char* limit[2] = { "k00000000000000010000", "z" };
    size_t limit_len[2] = { 21, 1 };
    leveldb_writeoptions_set_sync(woptions, 0);
    for (i = 0; i < n; i++) {
      snprintf(keybuf, sizeof(keybuf), "k%020d", i);
      snprintf(valbuf, sizeof(valbuf), "v%020d", i);
      leveldb_put(db, woptions, keybuf, strlen(keybuf), valbuf, strlen(valbuf),
                  &err);
      CheckNoError(err);
    }
    leveldb_approximate_sizes(db, 2, start, start_len, limit, limit_len, sizes);
    CheckCondition(sizes[0] > 0);
    CheckCondition(sizes[1] > 0);
  }

  StartPhase("property");
  {
    char* prop = leveldb_property_value(db, "nosuchprop");
    CheckCondition(prop == NULL);
    prop = leveldb_property_value(db, "leveldb.stats");
    CheckCondition(prop != NULL);
    Free(&prop);
  }

  StartPhase("snapshot");
  {
    const leveldb_snapshot_t* snap;
    snap = leveldb_create_snapshot(db);
    leveldb_delete(db, woptions, "foo", 3, &err);
    CheckNoError(err);
    leveldb_readoptions_set_snapshot(roptions, snap);
    CheckGet(db, roptions, "foo", "hello");
    leveldb_readoptions_set_snapshot(roptions, NULL);
    CheckGet(db, roptions, "foo", NULL);
    leveldb_release_snapshot(db, snap);
  }

  StartPhase("repair");
  {
    leveldb_close(db);
    leveldb_options_set_create_if_missing(options, 0);
    leveldb_options_set_error_if_exists(options, 0);
    leveldb_repair_db(options, dbname, &err);
    CheckNoError(err);
    db = leveldb_open(options, dbname, &err);
    CheckNoError(err);
    CheckGet(db, roptions, "foo", NULL);
    CheckGet(db, roptions, "bar", NULL);
    CheckGet(db, roptions, "box", "c");
    leveldb_options_set_create_if_missing(options, 1);
    leveldb_options_set_error_if_exists(options, 1);
  }

  StartPhase("filter");
  for (run = 0; run < 2; run++) {
    // First run uses custom filter, second run uses bloom filter
    CheckNoError(err);
    leveldb_filterpolicy_t* policy;
    if (run == 0) {
      policy = leveldb_filterpolicy_create(
          NULL, FilterDestroy, FilterCreate, FilterKeyMatch, FilterName);
    } else {
      policy = leveldb_filterpolicy_create_bloom(10);
    }

    // Create new database
    leveldb_close(db);
    leveldb_destroy_db(options, dbname, &err);
    leveldb_options_set_filter_policy(options, policy);
    db = leveldb_open(options, dbname, &err);
    CheckNoError(err);
    leveldb_put(db, woptions, "foo", 3, "foovalue", 8, &err);
    CheckNoError(err);
    leveldb_put(db, woptions, "bar", 3, "barvalue", 8, &err);
    CheckNoError(err);
    leveldb_compact_range(db, NULL, 0, NULL, 0);

    fake_filter_result = 1;
    CheckGet(db, roptions, "foo", "foovalue");
    CheckGet(db, roptions, "bar", "barvalue");
    if (phase == 0) {
      // Must not find value when custom filter returns false
      fake_filter_result = 0;
      CheckGet(db, roptions, "foo", NULL);
      CheckGet(db, roptions, "bar", NULL);
      fake_filter_result = 1;

      CheckGet(db, roptions, "foo", "foovalue");
      CheckGet(db, roptions, "bar", "barvalue");
    }
    leveldb_options_set_filter_policy(options, NULL);
    leveldb_filterpolicy_destroy(policy);
  }

  StartPhase("cleanup");
  leveldb_close(db);
  leveldb_options_destroy(options);
  leveldb_readoptions_destroy(roptions);
  leveldb_writeoptions_destroy(woptions);
  leveldb_free(dbname);
  leveldb_cache_destroy(cache);
  leveldb_comparator_destroy(cmp);
  leveldb_env_destroy(env);

  fprintf(stderr, "PASS\n");
  return 0;
}